

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O1

void deqp::gls::BufferTestUtil::fillWithRandomBytes(deUint8 *ptr,int numBytes,deUint32 seed)

{
  RandomValueIterator<unsigned_char> local_88;
  RandomValueIterator<unsigned_char> local_68;
  deRandom local_48;
  undefined4 local_38;
  uint uStack_34;
  RandomValueIterator<unsigned_char> local_30;
  
  tcu::RandomValueIterator<unsigned_char>::RandomValueIterator(&local_30,seed,numBytes);
  deRandom_init(&local_48,0);
  local_38 = 0;
  uStack_34 = uStack_34 & 0xffffff00;
  local_68.m_numLeft = local_30.m_numLeft;
  local_68.m_curVal = local_30.m_curVal;
  local_68._21_3_ = local_30._21_3_;
  local_68.m_rnd.m_rnd.x = local_30.m_rnd.m_rnd.x;
  local_68.m_rnd.m_rnd.y = local_30.m_rnd.m_rnd.y;
  local_68.m_rnd.m_rnd.z = local_30.m_rnd.m_rnd.z;
  local_68.m_rnd.m_rnd.w = local_30.m_rnd.m_rnd.w;
  local_88._16_8_ = (ulong)uStack_34 << 0x20;
  local_88.m_rnd.m_rnd.x = local_48.x;
  local_88.m_rnd.m_rnd.y = local_48.y;
  local_88.m_rnd.m_rnd.z = local_48.z;
  local_88.m_rnd.m_rnd.w = local_48.w;
  std::__copy_move<false,false,std::forward_iterator_tag>::
  __copy_m<tcu::RandomValueIterator<unsigned_char>,unsigned_char*>(&local_68,&local_88,ptr);
  return;
}

Assistant:

void fillWithRandomBytes (deUint8* ptr, int numBytes, deUint32 seed)
{
	std::copy(tcu::RandomValueIterator<deUint8>::begin(seed, numBytes), tcu::RandomValueIterator<deUint8>::end(), ptr);
}